

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_constraint.cpp
# Opt level: O2

void __thiscall
Animation_Constraint::Init_Target_Value(Animation_Constraint *this,Am_Slot *new_slot)

{
  bool bVar1;
  Am_Slot_Key AVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Wrapper *in_value;
  Am_Value_List slots;
  Am_Object_Advanced obj;
  Am_Object owner;
  Am_Value_List targets;
  Am_Slot local_38;
  
  if (this->must_initialize_instance == false) {
    Am_Slot::Get_Owner((Am_Slot *)&slots);
    Am_Object::Am_Object(&owner,(Am_Object *)&slots);
    Am_Object::~Am_Object((Am_Object *)&slots);
    Am_Object::Am_Object(&obj.super_Am_Object,&owner);
    AVar2 = Am_Slot::Get_Key(new_slot);
    if (this->multi_slot == true) {
      targets.data = (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar4 = Am_Slot::Get((Am_Slot *)&targets);
      Am_Value_List::Am_Value_List(&slots,pAVar4);
      Am_Value_List::Am_Value_List(&targets);
      Am_Value_List::Start(&slots);
      while( true ) {
        bVar1 = Am_Value_List::Last(&slots);
        if (bVar1) break;
        pAVar4 = Am_Value_List::Get(&slots);
        iVar3 = Am_Value::operator_cast_to_int(pAVar4);
        if (AVar2 == (Am_Slot_Key)iVar3) {
          pAVar4 = Am_Slot::Get(new_slot);
        }
        else {
          local_38 = Am_Object_Advanced::Get_Slot(&obj,(Am_Slot_Key)iVar3);
          pAVar4 = Am_Slot::Get(&local_38);
        }
        Am_Value_List::Add(&targets,pAVar4,Am_TAIL,true);
        Am_Value_List::Next(&slots);
      }
      in_value = Am_Value_List::operator_cast_to_Am_Wrapper_(&targets);
      Am_Value::operator=(&this->target,in_value);
      Am_Value_List::~Am_Value_List(&targets);
      Am_Value_List::~Am_Value_List(&slots);
    }
    else {
      slots.data = (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot(&this->interpolator,0xeb);
      pAVar4 = Am_Slot::Get((Am_Slot *)&slots);
      iVar3 = Am_Value::operator_cast_to_int(pAVar4);
      if (AVar2 == (Am_Slot_Key)iVar3) {
        pAVar4 = Am_Slot::Get(new_slot);
      }
      else {
        slots.data = (Am_Value_List_Data *)Am_Object_Advanced::Get_Slot(&obj,(Am_Slot_Key)iVar3);
        pAVar4 = Am_Slot::Get((Am_Slot *)&slots);
      }
      Am_Value::operator=(&this->target,pAVar4);
    }
    Am_Object::~Am_Object(&obj.super_Am_Object);
    Am_Object::~Am_Object(&owner);
  }
  return;
}

Assistant:

void
Animation_Constraint::Init_Target_Value(const Am_Slot &new_slot)
{
  if (must_initialize_instance)
    return;

  Am_Object owner = primary_slot.Get_Owner();
  Am_Object_Advanced obj = (Am_Object_Advanced &)owner;
  Am_Slot_Key key;
  Am_Slot_Key new_key = new_slot.Get_Key();

  if (multi_slot) {
    Am_Value_List slots = interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    Am_Value_List targets;

    for (slots.Start(); !slots.Last(); slots.Next()) {
      key = (int)slots.Get();
      targets.Add((key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get());
    }

    target = targets;
  } else {
    key = (int)interpolator.Get_Slot(Am_SLOT_TO_ANIMATE).Get();
    target = (key == new_key) ? new_slot.Get() : obj.Get_Slot(key).Get();
  }
}